

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O0

int ExUtilGetInts(char *v,int base,int max_output,int *output)

{
  uint uVar1;
  long in_RCX;
  int in_EDX;
  char *in_RDI;
  int value;
  int error;
  int n;
  int in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_24;
  char *local_10;
  
  local_24 = 0;
  local_10 = in_RDI;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffd0 & 0xffffff;
    if (local_10 != (char *)0x0) {
      uVar1 = CONCAT13(local_24 < in_EDX,(int3)in_stack_ffffffffffffffd0);
    }
    in_stack_ffffffffffffffd0 = uVar1;
    if ((char)(in_stack_ffffffffffffffd0 >> 0x18) == '\0') break;
    in_stack_ffffffffffffffd4 =
         ExUtilGetInt((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc,(int *)0x105d30);
    *(int *)(in_RCX + (long)local_24 * 4) = in_stack_ffffffffffffffd4;
    local_10 = strchr(local_10,0x2c);
    if (local_10 != (char *)0x0) {
      local_10 = local_10 + 1;
    }
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int ExUtilGetInts(const char* v, int base, int max_output, int output[]) {
  int n, error = 0;
  for (n = 0; v != NULL && n < max_output; ++n) {
    const int value = ExUtilGetInt(v, base, &error);
    if (error) return -1;
    output[n] = value;
    v = strchr(v, ',');
    if (v != NULL) ++v;   // skip over the trailing ','
  }
  return n;
}